

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::addPositional(QPDFArgParser *this,param_arg_handler_t *handler)

{
  OptionEntry *pOVar1;
  allocator<char> local_41;
  string local_40;
  OptionEntry *local_20;
  OptionEntry *oe;
  param_arg_handler_t *handler_local;
  QPDFArgParser *this_local;
  
  oe = (OptionEntry *)handler;
  handler_local = (param_arg_handler_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  pOVar1 = registerArg(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pOVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=(&pOVar1->param_arg_handler,handler);
  return;
}

Assistant:

void
QPDFArgParser::addPositional(param_arg_handler_t handler)
{
    OptionEntry& oe = registerArg("");
    oe.param_arg_handler = handler;
}